

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-condvar.c
# Opt level: O3

int run_test_condvar_2(void)

{
  uv_mutex_t *puVar1;
  short sVar2;
  int iVar3;
  uint uVar4;
  int extraout_EAX;
  int extraout_EAX_00;
  int extraout_EAX_01;
  int extraout_EAX_02;
  int extraout_EAX_03;
  uint64_t uVar5;
  uint64_t uVar6;
  uv_loop_t *puVar7;
  short *psVar8;
  ulong uVar9;
  int iVar10;
  code *pcVar11;
  sockaddr_in *addr;
  uv_sem_t *sem;
  uv_sem_t *puVar12;
  char *pcVar13;
  uv_connect_t *puVar14;
  uv_tcp_t *puVar15;
  bool bVar16;
  uv_thread_t thread;
  worker_config_conflict wc;
  sockaddr_in sStack_690;
  sockaddr_in sStack_680;
  uv_loop_t *puStack_670;
  uv_loop_t *puStack_668;
  code *pcStack_660;
  code *pcStack_658;
  sockaddr_in sStack_644;
  sockaddr_in6 sStack_634;
  uv_connect_t uStack_618;
  uv_tcp_t uStack_5b8;
  uv_connect_t uStack_4c0;
  uv_tcp_t uStack_460;
  uint64_t uStack_368;
  ulong uStack_360;
  worker_config_conflict wStack_358;
  worker_config_conflict *pwStack_2a0;
  uv_mutex_t *puStack_298;
  code *pcStack_290;
  uv_thread_t uStack_280;
  worker_config_conflict wStack_278;
  uv_sem_t *puStack_1c0;
  undefined1 *puStack_1b0;
  undefined1 auStack_190 [164];
  int iStack_ec;
  undefined1 auStack_e8 [8];
  code *pcStack_e0;
  code *pcStack_d8;
  worker_config_conflict *pwStack_d0;
  uv_thread_t uStack_c8;
  worker_config_conflict local_c0;
  
  pwStack_d0 = (worker_config_conflict *)0x1531e7;
  worker_config_init(&local_c0,1,condvar_signal,condvar_wait);
  pwStack_d0 = (worker_config_conflict *)0x1531f9;
  iVar3 = uv_thread_create(&uStack_c8,worker,&local_c0);
  if (iVar3 == 0) {
    pwStack_d0 = (worker_config_conflict *)0x15320d;
    iVar3 = (*local_c0.wait_cond)(&local_c0,&local_c0.posted_1);
    if (iVar3 != 0) goto LAB_00153247;
    pwStack_d0 = (worker_config_conflict *)0x153221;
    (*local_c0.signal_cond)(&local_c0,&local_c0.posted_2);
    pwStack_d0 = (worker_config_conflict *)0x153229;
    iVar3 = uv_thread_join(&uStack_c8);
    if (iVar3 == 0) {
      pwStack_d0 = (worker_config_conflict *)0x153237;
      worker_config_destroy(&local_c0);
      return 0;
    }
  }
  else {
    pwStack_d0 = (worker_config_conflict *)0x153247;
    run_test_condvar_2_cold_1();
LAB_00153247:
    pwStack_d0 = (worker_config_conflict *)0x15324c;
    run_test_condvar_2_cold_2();
  }
  pwStack_d0 = (worker_config_conflict *)run_test_condvar_3;
  run_test_condvar_2_cold_3();
  sem = (uv_sem_t *)auStack_190;
  puVar12 = (uv_sem_t *)auStack_190;
  pwStack_d0 = &local_c0;
  worker_config_init((worker_config_conflict *)(auStack_190 + 8),0,condvar_signal,condvar_timedwait)
  ;
  pcVar11 = worker;
  iVar3 = uv_thread_create((uv_thread_t *)auStack_190,worker,
                           (worker_config_conflict *)(auStack_190 + 8));
  if (iVar3 == 0) {
    (*pcStack_d8)((worker_config_conflict *)(auStack_190 + 8),&iStack_ec);
    pcVar11 = (code *)auStack_e8;
    (*pcStack_e0)((worker_config_conflict *)(auStack_190 + 8),(int *)pcVar11);
    iVar3 = uv_thread_join((uv_thread_t *)auStack_190);
    sem = puVar12;
    if (iVar3 == 0) {
      worker_config_destroy((worker_config_conflict *)(auStack_190 + 8));
      return 0;
    }
  }
  else {
    run_test_condvar_3_cold_1();
  }
  run_test_condvar_3_cold_2();
  puVar1 = (uv_mutex_t *)(sem + 2);
  puStack_1c0 = (uv_sem_t *)0x1532f2;
  puStack_1b0 = auStack_190 + 8;
  uv_mutex_lock(puVar1);
  puStack_1c0 = (uv_sem_t *)0x1532fa;
  uv_sem_post(sem);
  do {
    puStack_1c0 = (uv_sem_t *)0x15330e;
    iVar3 = uv_cond_timedwait((uv_cond_t *)((long)sem + 0x68),puVar1,1000000000);
    if (iVar3 != 0) {
      puStack_1c0 = (uv_sem_t *)0x153345;
      condvar_timedwait_cold_1();
      goto LAB_00153345;
    }
  } while (*(int *)pcVar11 == 0);
  if (*(int *)pcVar11 == 1) {
    puStack_1c0 = (uv_sem_t *)0x153326;
    uv_mutex_unlock(puVar1);
    puStack_1c0 = (uv_sem_t *)0x153332;
    uv_sem_wait(sem + 1);
    return 0;
  }
LAB_00153345:
  puStack_1c0 = (uv_sem_t *)run_test_condvar_4;
  condvar_timedwait_cold_2();
  puStack_1c0 = sem;
  worker_config_init(&wStack_278,1,condvar_signal,condvar_timedwait);
  iVar3 = uv_thread_create(&uStack_280,worker,&wStack_278);
  if (iVar3 == 0) {
    (*wStack_278.wait_cond)(&wStack_278,&wStack_278.posted_1);
    (*wStack_278.signal_cond)(&wStack_278,&wStack_278.posted_2);
    iVar3 = uv_thread_join(&uStack_280);
    if (iVar3 == 0) {
      worker_config_destroy(&wStack_278);
      return 0;
    }
  }
  else {
    run_test_condvar_4_cold_1();
  }
  run_test_condvar_4_cold_2();
  uStack_360 = 0x1533ef;
  pwStack_2a0 = &wStack_278;
  puStack_298 = puVar1;
  pcStack_290 = pcVar11;
  worker_config_init(&wStack_358,0,(signal_func)0x0,(wait_func)0x0);
  puVar1 = &wStack_358.mutex;
  uStack_360 = 0x1533fc;
  uv_mutex_lock(puVar1);
  uStack_360 = 0x153401;
  uVar5 = uv_hrtime();
  uStack_360 = 0x153416;
  uVar4 = uv_cond_timedwait(&wStack_358.cond,puVar1,100000000);
  uStack_360 = 0x15341d;
  uVar6 = uv_hrtime();
  uStack_360 = 0x153428;
  uv_mutex_unlock(puVar1);
  if (uVar4 == 0xffffff92) {
    if (uVar6 - uVar5 < 75000000) goto LAB_0015345f;
    if (uVar6 - uVar5 < 0x1dcd6501) {
      uStack_360 = 0x15344a;
      worker_config_destroy(&wStack_358);
      return 0;
    }
  }
  else {
    uStack_360 = 0x15345f;
    run_test_condvar_5_cold_1();
LAB_0015345f:
    uStack_360 = 0x153464;
    run_test_condvar_5_cold_2();
  }
  uStack_360 = 0x153469;
  run_test_condvar_5_cold_3();
  pcStack_658 = (code *)0x15347a;
  uStack_368 = uVar5;
  uStack_360 = (ulong)uVar4;
  puVar7 = uv_default_loop();
  puVar15 = &uStack_460;
  pcStack_658 = (code *)0x15348d;
  iVar3 = uv_tcp_init(puVar7,puVar15);
  iVar10 = (int)puVar15;
  if (iVar3 == 0) {
    iVar10 = 0x23a3;
    pcStack_658 = (code *)0x1534ab;
    iVar3 = uv_ip4_addr("0.0.0.0",0x23a3,&sStack_644);
    if (iVar3 != 0) goto LAB_001535bb;
    puVar15 = &uStack_460;
    pcStack_658 = (code *)0x1534d4;
    iVar3 = uv_tcp_connect(&uStack_4c0,puVar15,(sockaddr *)&sStack_644,connect_4);
    iVar10 = (int)puVar15;
    if (iVar3 != 0) goto LAB_001535c0;
    pcStack_658 = (code *)0x1534ee;
    iVar3 = uv_interface_addresses((uv_interface_address_t **)&uStack_5b8,(int *)&uStack_618);
    if (iVar3 != 0) {
LAB_001534f2:
      iVar10 = 0;
      pcStack_658 = (code *)0x1534fc;
      iVar3 = uv_run(puVar7,UV_RUN_DEFAULT);
      if (iVar3 == 0) {
        return 0;
      }
      goto LAB_001535c5;
    }
    puVar14 = (uv_connect_t *)uStack_5b8.data;
    if ((long)(int)uStack_618.data < 1) {
LAB_001535ac:
      pcStack_658 = (code *)0x1535b1;
      uv_free_interface_addresses((uv_interface_address_t *)puVar14,(int)uStack_618.data);
      goto LAB_001534f2;
    }
    psVar8 = (short *)((long)((long)uStack_5b8.data + 0x10) + 4);
    uVar9 = 1;
    do {
      sVar2 = *psVar8;
      if (sVar2 == 10) break;
      psVar8 = psVar8 + 0x28;
      bVar16 = uVar9 < (ulong)(long)(int)uStack_618.data;
      uVar9 = uVar9 + 1;
    } while (bVar16);
    pcStack_658 = (code *)0x15354d;
    uv_free_interface_addresses((uv_interface_address_t *)uStack_5b8.data,(int)uStack_618.data);
    if (sVar2 != 10) goto LAB_001534f2;
    puVar15 = &uStack_5b8;
    pcStack_658 = (code *)0x153563;
    iVar3 = uv_tcp_init(puVar7,puVar15);
    iVar10 = (int)puVar15;
    if (iVar3 != 0) goto LAB_001535ca;
    iVar10 = 0x23a3;
    pcStack_658 = (code *)0x15357d;
    iVar3 = uv_ip6_addr("::",0x23a3,&sStack_634);
    if (iVar3 == 0) {
      puVar14 = &uStack_618;
      puVar15 = &uStack_5b8;
      pcStack_658 = (code *)0x15359f;
      iVar3 = uv_tcp_connect(puVar14,puVar15,(sockaddr *)&sStack_634,connect_6);
      uStack_618.data._0_4_ = (int)puVar15;
      if (iVar3 != 0) {
        pcStack_658 = (code *)0x1535ac;
        run_test_connect_unspecified_cold_6();
        goto LAB_001535ac;
      }
      goto LAB_001534f2;
    }
  }
  else {
    pcStack_658 = (code *)0x1535bb;
    run_test_connect_unspecified_cold_1();
LAB_001535bb:
    pcStack_658 = (code *)0x1535c0;
    run_test_connect_unspecified_cold_2();
LAB_001535c0:
    pcStack_658 = (code *)0x1535c5;
    run_test_connect_unspecified_cold_3();
LAB_001535c5:
    pcStack_658 = (code *)0x1535ca;
    run_test_connect_unspecified_cold_7();
LAB_001535ca:
    pcStack_658 = (code *)0x1535cf;
    run_test_connect_unspecified_cold_4();
  }
  pcStack_658 = connect_4;
  run_test_connect_unspecified_cold_5();
  if (iVar10 != -99) {
    return extraout_EAX;
  }
  pcStack_660 = connect_6;
  connect_4_cold_1();
  if (iVar10 != -99) {
    return extraout_EAX_00;
  }
  puStack_668 = (uv_loop_t *)run_test_connection_fail;
  connect_6_cold_1();
  pcVar11 = on_connect_with_close;
  puStack_670 = (uv_loop_t *)0x1535f9;
  puStack_668 = puVar7;
  connection_fail(on_connect_with_close);
  if (timer_close_cb_calls == 0) {
    if (timer_cb_calls != 0) goto LAB_0015364d;
    puStack_670 = (uv_loop_t *)0x153610;
    puVar7 = uv_default_loop();
    puStack_670 = (uv_loop_t *)0x153624;
    uv_walk(puVar7,close_walk_cb,(void *)0x0);
    puStack_670 = (uv_loop_t *)0x15362e;
    uv_run(puVar7,UV_RUN_DEFAULT);
    puStack_670 = (uv_loop_t *)0x153633;
    pcVar11 = (code *)uv_default_loop();
    puStack_670 = (uv_loop_t *)0x15363b;
    iVar3 = uv_loop_close((uv_loop_t *)pcVar11);
    if (iVar3 == 0) {
      puStack_670 = (uv_loop_t *)0x153644;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    puStack_670 = (uv_loop_t *)0x15364d;
    run_test_connection_fail_cold_1();
LAB_0015364d:
    puStack_670 = (uv_loop_t *)0x153652;
    run_test_connection_fail_cold_2();
  }
  puStack_670 = (uv_loop_t *)connection_fail;
  run_test_connection_fail_cold_3();
  pcVar13 = "0.0.0.0";
  iVar10 = 0;
  puStack_670 = puVar7;
  iVar3 = uv_ip4_addr("0.0.0.0",0,&sStack_680);
  if (iVar3 == 0) {
    puVar14 = (uv_connect_t *)0x1b4e4a;
    iVar10 = 0x23a3;
    iVar3 = uv_ip4_addr("127.0.0.1",0x23a3,&sStack_690);
    if (iVar3 != 0) goto LAB_0015370a;
    puVar14 = (uv_connect_t *)uv_default_loop();
    iVar10 = 0x30ec30;
    iVar3 = uv_tcp_init((uv_loop_t *)puVar14,&tcp);
    if (iVar3 != 0) goto LAB_0015370f;
    puVar15 = &tcp;
    addr = &sStack_680;
    iVar3 = uv_tcp_bind(&tcp,(sockaddr *)addr,0);
    iVar10 = (int)addr;
    puVar14 = (uv_connect_t *)puVar15;
    if (iVar3 != 0) goto LAB_00153714;
    puVar14 = &req;
    iVar10 = 0x30ec30;
    iVar3 = uv_tcp_connect(&req,&tcp,(sockaddr *)&sStack_690,pcVar11);
    if (iVar3 != 0) goto LAB_00153719;
    puVar14 = (uv_connect_t *)uv_default_loop();
    iVar10 = 0;
    iVar3 = uv_run((uv_loop_t *)puVar14,UV_RUN_DEFAULT);
    if (connect_cb_calls != 1) goto LAB_0015371e;
    if (close_cb_calls == 1) {
      return iVar3;
    }
  }
  else {
    connection_fail_cold_1();
    puVar14 = (uv_connect_t *)pcVar13;
LAB_0015370a:
    connection_fail_cold_2();
LAB_0015370f:
    connection_fail_cold_3();
LAB_00153714:
    connection_fail_cold_4();
LAB_00153719:
    connection_fail_cold_5();
LAB_0015371e:
    connection_fail_cold_6();
  }
  connection_fail_cold_7();
  if ((uv_tcp_t *)((uv_loop_t *)puVar14)->pending_queue[0] == &tcp) {
    if (iVar10 != -0x6f) goto LAB_00153763;
    connect_cb_calls = connect_cb_calls + 1;
    if (close_cb_calls == 0) {
      uv_close((uv_handle_t *)&tcp,on_close);
      return extraout_EAX_01;
    }
  }
  else {
    on_connect_with_close_cold_1();
LAB_00153763:
    on_connect_with_close_cold_2();
  }
  on_connect_with_close_cold_3();
  puVar7 = uv_default_loop();
  iVar10 = 0x30eb98;
  iVar3 = uv_timer_init(puVar7,&timer);
  if (iVar3 == 0) {
    connection_fail(on_connect_without_close);
    if (timer_close_cb_calls != 1) goto LAB_001537e6;
    if (timer_cb_calls == 1) {
      puVar7 = uv_default_loop();
      uv_walk(puVar7,close_walk_cb,(void *)0x0);
      iVar10 = 0;
      uv_run(puVar7,UV_RUN_DEFAULT);
      puVar7 = uv_default_loop();
      iVar3 = uv_loop_close(puVar7);
      if (iVar3 == 0) {
        uv_library_shutdown();
        return 0;
      }
      goto LAB_001537f0;
    }
  }
  else {
    run_test_connection_fail_doesnt_auto_close_cold_1();
LAB_001537e6:
    run_test_connection_fail_doesnt_auto_close_cold_2();
  }
  run_test_connection_fail_doesnt_auto_close_cold_3();
LAB_001537f0:
  run_test_connection_fail_doesnt_auto_close_cold_4();
  if (iVar10 == -0x6f) {
    connect_cb_calls = connect_cb_calls + 1;
    uv_timer_start(&timer,timer_cb,100,0);
    if (close_cb_calls == 0) {
      return extraout_EAX_02;
    }
  }
  else {
    on_connect_without_close_cold_1();
  }
  on_connect_without_close_cold_2();
  close_cb_calls = close_cb_calls + 1;
  return extraout_EAX_03;
}

Assistant:

TEST_IMPL(condvar_2) {
  worker_config wc;
  uv_thread_t thread;

  /* Helper to signal-then-wait. */
  worker_config_init(&wc, 1, condvar_signal, condvar_wait);
  ASSERT(0 == uv_thread_create(&thread, worker, &wc));

  /* We wait-then-signal. */
  ASSERT(0 == wc.wait_cond(&wc, &wc.posted_1));
  wc.signal_cond(&wc, &wc.posted_2);

  ASSERT(0 == uv_thread_join(&thread));
  worker_config_destroy(&wc);

  return 0;
}